

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * __thiscall
lest::to_string<std::__cxx11::string,char[34]>
          (string *__return_storage_ptr__,lest *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,string *op,
          char (*rhs) [34])

{
  ostream *poVar1;
  char **txt;
  string *local_1f8;
  string local_1f0;
  string local_1c0;
  ostringstream local_1a0 [8];
  ostringstream os;
  char (*rhs_local) [34];
  string *op_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  to_string(&local_1c0,(string *)this);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  local_1f8 = op;
  to_string_abi_cxx11_(&local_1f0,(lest *)&local_1f8,txt);
  std::operator<<(poVar1,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}